

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::anon_unknown_1::AssertionPrinter::printResultType
          (AssertionPrinter *this,Code colour,string *passOrFail)

{
  ostream *poVar1;
  Colour local_19 [8];
  Colour colourGuard;
  
  if (passOrFail->_M_string_length != 0) {
    local_19[0].m_moved = false;
    Colour::use(colour);
    poVar1 = std::operator<<(this->stream,' ');
    std::operator<<(poVar1,(string *)passOrFail);
    Colour::~Colour(local_19);
    std::operator<<(this->stream,':');
    return;
  }
  return;
}

Assistant:

void printResultType(Colour::Code colour, std::string const& passOrFail) const {
                if (!passOrFail.empty()) {
                    {
                        Colour colourGuard(colour);
                        stream << ' ' << passOrFail;
                    }
                    stream << ':';
                }
            }